

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::import_<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *p_Var1;
  __index_type *__return_storage_ptr___00;
  __index_type *__return_storage_ptr___01;
  TableType type_00;
  MemType type_01;
  Name name_00;
  Name name_01;
  bool bVar2;
  size_t sVar3;
  Name *pNVar4;
  TableType *pTVar5;
  MemType *pMVar6;
  Err *pEVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  Ok local_81a;
  allocator<char> local_819;
  string local_818;
  Err local_7f8;
  allocator<char> local_7d1;
  string local_7d0;
  Err local_7b0;
  allocator<char> local_789;
  string local_788;
  Err local_768;
  Err local_748;
  Err *local_728;
  Err *err_9;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_718;
  Name local_700;
  undefined1 local_6f0 [8];
  Result<wasm::Ok> _val_9;
  Err *err_8;
  Result<wasm::Ok> _val_8;
  Result<wasm::Ok> type_4;
  optional<wasm::Name> name_4;
  Err local_628;
  Err *local_608;
  Err *err_7;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_5f8;
  Name local_5d8;
  undefined1 local_5c8 [8];
  Result<wasm::Ok> _val_7;
  Err *err_6;
  Result<wasm::Ok> _val_6;
  Result<wasm::Ok> type_3;
  optional<wasm::Name> name_3;
  Err local_500;
  Err *local_4e0;
  Err *err_5;
  uint64_t uStack_4d0;
  unsigned_long local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_4a8;
  Name local_488;
  undefined1 local_478 [8];
  Result<wasm::Ok> _val_5;
  Err *err_4;
  Result<wasm::WATParser::MemType> _val_4;
  Result<wasm::WATParser::MemType> type_2;
  optional<wasm::Name> name_2;
  Err local_3a0;
  Err *local_380;
  Err *err_3;
  uint64_t uStack_370;
  unsigned_long local_368;
  undefined8 uStack_360;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_358;
  Name local_338;
  undefined1 local_328 [8];
  Result<wasm::Ok> _val_3;
  Err *err_2;
  Result<wasm::WATParser::TableType> _val_2;
  Result<wasm::WATParser::TableType> type_1;
  optional<wasm::Name> name_1;
  Err local_260;
  Err *local_240;
  Err *err_1;
  pointer pAStack_230;
  pointer local_228;
  _Optional_base<wasm::Ok,_true,_true> local_21b;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_218;
  Name local_200;
  undefined1 local_1f0 [8];
  Result<wasm::Ok> _val_1;
  Err local_1c0;
  Err *local_1a0;
  Err *err;
  Result<wasm::Ok> _val;
  Result<wasm::Ok> type;
  optional<wasm::Name> name;
  undefined1 local_120 [8];
  ImportNames names;
  string local_f8;
  Err local_d8;
  undefined1 local_b8 [8];
  optional<wasm::Name> nm;
  allocator<char> local_89;
  string local_88;
  Err local_68;
  undefined1 local_48 [8];
  optional<wasm::Name> mod;
  Index local_20;
  size_t pos;
  ParseDeclsCtx *ctx_local;
  
  sVar3 = Lexer::getPos(&ctx->in);
  join_0x00000010_0x00000000_ = sv("import",6);
  bVar2 = Lexer::takeSExprStart(&ctx->in,join_0x00000010_0x00000000_);
  if (bVar2) {
    Lexer::takeName((optional<wasm::Name> *)local_48,&ctx->in);
    bVar2 = std::optional::operator_cast_to_bool((optional *)local_48);
    if (bVar2) {
      Lexer::takeName((optional<wasm::Name> *)local_b8,&ctx->in);
      bVar2 = std::optional::operator_cast_to_bool((optional *)local_b8);
      if (bVar2) {
        pNVar4 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_48);
        local_120 = (undefined1  [8])(pNVar4->super_IString).str._M_len;
        names.mod.super_IString.str._M_len = (size_t)(pNVar4->super_IString).str._M_str;
        pNVar4 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_b8);
        names.mod.super_IString.str._M_str = (char *)(pNVar4->super_IString).str._M_len;
        names.nm.super_IString.str._M_len = (size_t)(pNVar4->super_IString).str._M_str;
        bVar8 = sv("func",4);
        bVar2 = Lexer::takeSExprStart(&ctx->in,bVar8);
        local_20 = (Index)sVar3;
        if (bVar2) {
          Lexer::takeID((optional<wasm::Name> *)
                        ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in);
          p_Var1 = (__index_type *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
          typeuse<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,ctx,true);
          Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err,(Result<wasm::Ok> *)p_Var1);
          local_1a0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = local_1a0 != (Err *)0x0;
          if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
            wasm::Err::Err(&local_1c0,local_1a0);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1c0);
            wasm::Err::~Err(&local_1c0);
          }
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
          if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
            bVar2 = std::optional::operator_cast_to_bool
                              ((optional *)
                               ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            if (bVar2) {
              pNVar4 = std::optional<wasm::Name>::operator*
                                 ((optional<wasm::Name> *)
                                  ((long)&type.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              local_200.super_IString.str._M_len = (pNVar4->super_IString).str._M_len;
              local_200.super_IString.str._M_str = (pNVar4->super_IString).str._M_str;
            }
            else {
              wasm::Name::Name(&local_200);
            }
            local_218.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_218.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_218.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_218);
            Result<wasm::Ok>::operator*
                      ((Result<wasm::Ok> *)
                       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            std::optional<wasm::Ok>::optional((optional<wasm::Ok> *)&local_21b);
            err_1 = (Err *)0x0;
            pAStack_230 = (pointer)0x0;
            local_228 = (pointer)0x0;
            std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
            vector((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                    *)&err_1);
            ParseDeclsCtx::addFunc
                      (local_1f0,ctx,local_200.super_IString.str._M_len,
                       local_200.super_IString.str._M_str,&local_218,local_120,
                       local_21b._M_payload.super__Optional_payload_base<wasm::Ok>,
                       (int)(vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                             *)&err_1,local_20);
            std::vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
            ~vector((vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
                     *)&err_1);
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_218);
            local_240 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_1f0);
            bVar2 = local_240 != (Err *)0x0;
            if (bVar2) {
              wasm::Err::Err(&local_260,local_240);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_260);
              wasm::Err::~Err(&local_260);
            }
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar2;
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_1f0);
            if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
            }
          }
          Result<wasm::Ok>::~Result
                    ((Result<wasm::Ok> *)
                     ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        else {
          bVar8 = sv("table",5);
          bVar2 = Lexer::takeSExprStart(&ctx->in,bVar8);
          if (bVar2) {
            Lexer::takeID((optional<wasm::Name> *)
                          ((long)&type_1.val.
                                  super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                  super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> +
                          0x20),&ctx->in);
            __return_storage_ptr___00 =
                 (__index_type *)
                 ((long)&_val_2.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20);
            tabletype<wasm::WATParser::ParseDeclsCtx>
                      ((Result<wasm::WATParser::TableType> *)__return_storage_ptr___00,ctx);
            Result<wasm::WATParser::TableType>::Result
                      ((Result<wasm::WATParser::TableType> *)&err_2,
                       (Result<wasm::WATParser::TableType> *)__return_storage_ptr___00);
            pEVar7 = Result<wasm::WATParser::TableType>::getErr
                               ((Result<wasm::WATParser::TableType> *)&err_2);
            if (pEVar7 != (Err *)0x0) {
              wasm::Err::Err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                             pEVar7);
              MaybeResult<wasm::Ok>::MaybeResult
                        (__return_storage_ptr__,
                         (Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              wasm::Err::~Err((Err *)((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            }
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar7 != (Err *)0x0;
            Result<wasm::WATParser::TableType>::~Result
                      ((Result<wasm::WATParser::TableType> *)&err_2);
            if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
              bVar2 = std::optional::operator_cast_to_bool
                                ((optional *)
                                 ((long)&type_1.val.
                                         super__Variant_base<wasm::WATParser::TableType,_wasm::Err>.
                                         super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                         .
                                         super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                         .
                                         super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                         .
                                         super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                 + 0x20));
              if (bVar2) {
                pNVar4 = std::optional<wasm::Name>::operator*
                                   ((optional<wasm::Name> *)
                                    ((long)&type_1.val.
                                            super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                                            .
                                            super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                            .
                                            super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                    + 0x20));
                local_338.super_IString.str._M_len = (pNVar4->super_IString).str._M_len;
                local_338.super_IString.str._M_str = (pNVar4->super_IString).str._M_str;
              }
              else {
                wasm::Name::Name(&local_338);
              }
              local_358.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_358.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_358.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_358);
              pTVar5 = Result<wasm::WATParser::TableType>::operator*
                                 ((Result<wasm::WATParser::TableType> *)
                                  ((long)&_val_2.val.
                                          super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                          .
                                          super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err>
                                  + 0x20));
              err_3 = (Err *)(pTVar5->addressType).id;
              uStack_370 = (pTVar5->limits).initial;
              local_368 = (pTVar5->limits).max.super__Optional_base<unsigned_long,_true,_true>.
                          _M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value
              ;
              uStack_360 = *(undefined8 *)
                            &(pTVar5->limits).max.super__Optional_base<unsigned_long,_true,_true>.
                             _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged;
              name_01.super_IString.str._M_str = local_338.super_IString.str._M_str;
              name_01.super_IString.str._M_len = local_338.super_IString.str._M_len;
              type_00.limits.initial._4_4_ = (int)(uStack_370 >> 0x20);
              type_00._0_12_ = *(undefined1 (*) [12])pTVar5;
              type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_4_ = (int)local_368
              ;
              type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_payload._M_value._4_4_ =
                   (int)(local_368 >> 0x20);
              type_00.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._8_8_ = uStack_360;
              ParseDeclsCtx::addTable
                        ((Result<wasm::Ok> *)local_328,ctx,name_01,&local_358,
                         (ImportNames *)local_120,type_00,local_20);
              std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_358);
              local_380 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_328);
              bVar2 = local_380 != (Err *)0x0;
              if (bVar2) {
                wasm::Err::Err(&local_3a0,local_380);
                MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3a0);
                wasm::Err::~Err(&local_3a0);
              }
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar2;
              Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_328);
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
              }
            }
            Result<wasm::WATParser::TableType>::~Result
                      ((Result<wasm::WATParser::TableType> *)
                       ((long)&_val_2.val.super__Variant_base<wasm::WATParser::TableType,_wasm::Err>
                               .super__Move_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_assign_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Move_ctor_alias<wasm::WATParser::TableType,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::WATParser::TableType,_wasm::Err> + 0x20)
                      );
          }
          else {
            bVar8 = sv("memory",6);
            bVar2 = Lexer::takeSExprStart(&ctx->in,bVar8);
            if (bVar2) {
              Lexer::takeID((optional<wasm::Name> *)
                            ((long)&type_2.val.
                                    super__Variant_base<wasm::WATParser::MemType,_wasm::Err>.
                                    super__Move_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::WATParser::MemType,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::WATParser::MemType,_wasm::Err> +
                            0x28),&ctx->in);
              __return_storage_ptr___01 =
                   (__index_type *)
                   ((long)&_val_4.val.super__Variant_base<wasm::WATParser::MemType,_wasm::Err>.
                           super__Move_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::WATParser::MemType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::WATParser::MemType,_wasm::Err> + 0x28);
              memtype<wasm::WATParser::ParseDeclsCtx>
                        ((Result<wasm::WATParser::MemType> *)__return_storage_ptr___01,ctx);
              Result<wasm::WATParser::MemType>::Result
                        ((Result<wasm::WATParser::MemType> *)&err_4,
                         (Result<wasm::WATParser::MemType> *)__return_storage_ptr___01);
              pEVar7 = Result<wasm::WATParser::MemType>::getErr
                                 ((Result<wasm::WATParser::MemType> *)&err_4);
              if (pEVar7 != (Err *)0x0) {
                wasm::Err::Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                              super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                               pEVar7);
                MaybeResult<wasm::Ok>::MaybeResult
                          (__return_storage_ptr__,
                           (Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                wasm::Err::~Err((Err *)((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              }
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
              _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar7 != (Err *)0x0;
              Result<wasm::WATParser::MemType>::~Result((Result<wasm::WATParser::MemType> *)&err_4);
              if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                bVar2 = std::optional::operator_cast_to_bool
                                  ((optional *)
                                   ((long)&type_2.val.
                                           super__Variant_base<wasm::WATParser::MemType,_wasm::Err>.
                                           super__Move_assign_alias<wasm::WATParser::MemType,_wasm::Err>
                                           .
                                           super__Copy_assign_alias<wasm::WATParser::MemType,_wasm::Err>
                                           .
                                           super__Move_ctor_alias<wasm::WATParser::MemType,_wasm::Err>
                                           .
                                           super__Copy_ctor_alias<wasm::WATParser::MemType,_wasm::Err>
                                   + 0x28));
                if (bVar2) {
                  pNVar4 = std::optional<wasm::Name>::operator*
                                     ((optional<wasm::Name> *)
                                      ((long)&type_2.val.
                                              super__Variant_base<wasm::WATParser::MemType,_wasm::Err>
                                              .
                                              super__Move_assign_alias<wasm::WATParser::MemType,_wasm::Err>
                                              .
                                              super__Copy_assign_alias<wasm::WATParser::MemType,_wasm::Err>
                                              .
                                              super__Move_ctor_alias<wasm::WATParser::MemType,_wasm::Err>
                                              .
                                              super__Copy_ctor_alias<wasm::WATParser::MemType,_wasm::Err>
                                      + 0x28));
                  local_488.super_IString.str._M_len = (pNVar4->super_IString).str._M_len;
                  local_488.super_IString.str._M_str = (pNVar4->super_IString).str._M_str;
                }
                else {
                  wasm::Name::Name(&local_488);
                }
                local_4a8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_4a8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_4a8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_4a8);
                pMVar6 = Result<wasm::WATParser::MemType>::operator*
                                   ((Result<wasm::WATParser::MemType> *)
                                    ((long)&_val_4.val.
                                            super__Variant_base<wasm::WATParser::MemType,_wasm::Err>
                                            .
                                            super__Move_assign_alias<wasm::WATParser::MemType,_wasm::Err>
                                            .
                                            super__Copy_assign_alias<wasm::WATParser::MemType,_wasm::Err>
                                            .
                                            super__Move_ctor_alias<wasm::WATParser::MemType,_wasm::Err>
                                            .
                                            super__Copy_ctor_alias<wasm::WATParser::MemType,_wasm::Err>
                                    + 0x28));
                local_4b8 = *(undefined8 *)&pMVar6->shared;
                err_5 = (Err *)(pMVar6->addressType).id;
                uStack_4d0 = (pMVar6->limits).initial;
                local_4c8 = (pMVar6->limits).max.super__Optional_base<unsigned_long,_true,_true>.
                            _M_payload.super__Optional_payload_base<unsigned_long>._M_payload.
                            _M_value;
                uStack_4c0 = *(undefined8 *)
                              &(pMVar6->limits).max.super__Optional_base<unsigned_long,_true,_true>.
                               _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged;
                name_00.super_IString.str._M_str = local_488.super_IString.str._M_str;
                name_00.super_IString.str._M_len = local_488.super_IString.str._M_len;
                type_01.limits.initial._4_4_ = (int)(uStack_4d0 >> 0x20);
                type_01._0_12_ = *(undefined1 (*) [12])pMVar6;
                type_01.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_4_ =
                     (int)local_4c8;
                type_01.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_payload._M_value._4_4_ =
                     (int)(local_4c8 >> 0x20);
                type_01.limits.max.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._8_8_ = uStack_4c0;
                type_01._32_4_ = (int)local_4b8;
                type_01._36_4_ = (int)((ulong)local_4b8 >> 0x20);
                ParseDeclsCtx::addMemory
                          ((Result<wasm::Ok> *)local_478,ctx,name_00,&local_4a8,
                           (ImportNames *)local_120,type_01,local_20);
                std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_4a8);
                local_4e0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_478);
                bVar2 = local_4e0 != (Err *)0x0;
                if (bVar2) {
                  wasm::Err::Err(&local_500,local_4e0);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_500);
                  wasm::Err::~Err(&local_500);
                }
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar2;
                Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_478);
                if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                }
              }
              Result<wasm::WATParser::MemType>::~Result
                        ((Result<wasm::WATParser::MemType> *)
                         ((long)&_val_4.val.super__Variant_base<wasm::WATParser::MemType,_wasm::Err>
                                 .super__Move_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::WATParser::MemType,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::WATParser::MemType,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::WATParser::MemType,_wasm::Err> + 0x28)
                        );
            }
            else {
              bVar8 = sv("global",6);
              bVar2 = Lexer::takeSExprStart(&ctx->in,bVar8);
              if (bVar2) {
                Lexer::takeID((optional<wasm::Name> *)
                              ((long)&type_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in);
                p_Var1 = (__index_type *)
                         ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
                globaltype<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,ctx);
                Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_6,(Result<wasm::Ok> *)p_Var1);
                pEVar7 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_6);
                if (pEVar7 != (Err *)0x0) {
                  wasm::Err::Err((Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                                 pEVar7);
                  MaybeResult<wasm::Ok>::MaybeResult
                            (__return_storage_ptr__,
                             (Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                  wasm::Err::~Err((Err *)((long)&_val_7.val.super__Variant_base<wasm::Ok,_wasm::Err>
                                                 .super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20)
                                 );
                }
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar7 != (Err *)0x0;
                Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_6);
                if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                  bVar2 = std::optional::operator_cast_to_bool
                                    ((optional *)
                                     ((long)&type_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                  if (bVar2) {
                    pNVar4 = std::optional<wasm::Name>::operator*
                                       ((optional<wasm::Name> *)
                                        ((long)&type_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20))
                    ;
                    local_5d8.super_IString.str._M_len = (pNVar4->super_IString).str._M_len;
                    local_5d8.super_IString.str._M_str = (pNVar4->super_IString).str._M_str;
                  }
                  else {
                    wasm::Name::Name(&local_5d8);
                  }
                  local_5f8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_5f8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_5f8.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_5f8);
                  Result<wasm::Ok>::operator*
                            ((Result<wasm::Ok> *)
                             ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                  std::optional<wasm::Ok>::optional((optional<wasm::Ok> *)((long)&err_7 + 5));
                  ParseDeclsCtx::addGlobal
                            (local_5c8,ctx,local_5d8.super_IString.str._M_len,
                             local_5d8.super_IString.str._M_str,&local_5f8,local_120,err_7._5_2_,
                             local_20);
                  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_5f8);
                  local_608 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_5c8);
                  bVar2 = local_608 != (Err *)0x0;
                  if (bVar2) {
                    wasm::Err::Err(&local_628,local_608);
                    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_628);
                    wasm::Err::~Err(&local_628);
                  }
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar2;
                  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_5c8);
                  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                  }
                }
                Result<wasm::Ok>::~Result
                          ((Result<wasm::Ok> *)
                           ((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              }
              else {
                bVar8 = sv("tag",3);
                bVar2 = Lexer::takeSExprStart(&ctx->in,bVar8);
                if (!bVar2) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_788,"expected import description",&local_789);
                  Lexer::err(&local_768,&ctx->in,&local_788);
                  MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_768);
                  wasm::Err::~Err(&local_768);
                  std::__cxx11::string::~string((string *)&local_788);
                  std::allocator<char>::~allocator(&local_789);
                  return __return_storage_ptr__;
                }
                Lexer::takeID((optional<wasm::Name> *)
                              ((long)&type_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),&ctx->in);
                p_Var1 = (__index_type *)
                         ((long)&_val_8.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
                typeuse<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,ctx,true);
                Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_8,(Result<wasm::Ok> *)p_Var1);
                pEVar7 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_8);
                if (pEVar7 != (Err *)0x0) {
                  wasm::Err::Err((Err *)((long)&_val_9.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                                 pEVar7);
                  MaybeResult<wasm::Ok>::MaybeResult
                            (__return_storage_ptr__,
                             (Err *)((long)&_val_9.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                            super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                  wasm::Err::~Err((Err *)((long)&_val_9.val.super__Variant_base<wasm::Ok,_wasm::Err>
                                                 .super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20)
                                 );
                }
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar7 != (Err *)0x0;
                Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_8);
                if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                  bVar2 = std::optional::operator_cast_to_bool
                                    ((optional *)
                                     ((long)&type_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                  if (bVar2) {
                    pNVar4 = std::optional<wasm::Name>::operator*
                                       ((optional<wasm::Name> *)
                                        ((long)&type_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20))
                    ;
                    local_700.super_IString.str._M_len = (pNVar4->super_IString).str._M_len;
                    local_700.super_IString.str._M_str = (pNVar4->super_IString).str._M_str;
                  }
                  else {
                    wasm::Name::Name(&local_700);
                  }
                  local_718.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  local_718.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_718.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector(&local_718);
                  Result<wasm::Ok>::operator*
                            ((Result<wasm::Ok> *)
                             ((long)&_val_8.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
                  ParseDeclsCtx::addTag
                            (local_6f0,ctx,local_700.super_IString.str._M_len,
                             local_700.super_IString.str._M_str,&local_718,local_120,local_20);
                  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_718);
                  local_728 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_6f0);
                  bVar2 = local_728 != (Err *)0x0;
                  if (bVar2) {
                    wasm::Err::Err(&local_748,local_728);
                    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_748);
                    wasm::Err::~Err(&local_748);
                  }
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
                  _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar2;
                  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_6f0);
                  if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
                    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
                  }
                }
                Result<wasm::Ok>::~Result
                          ((Result<wasm::Ok> *)
                           ((long)&_val_8.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              }
            }
          }
        }
        if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
          bVar2 = Lexer::takeRParen(&ctx->in);
          if (bVar2) {
            bVar2 = Lexer::takeRParen(&ctx->in);
            if (bVar2) {
              MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_81a);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_818,"expected end of import",&local_819);
              Lexer::err(&local_7f8,&ctx->in,&local_818);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_7f8);
              wasm::Err::~Err(&local_7f8);
              std::__cxx11::string::~string((string *)&local_818);
              std::allocator<char>::~allocator(&local_819);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_7d0,"expected end of import description",&local_7d1);
            Lexer::err(&local_7b0,&ctx->in,&local_7d0);
            MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_7b0);
            wasm::Err::~Err(&local_7b0);
            std::__cxx11::string::~string((string *)&local_7d0);
            std::allocator<char>::~allocator(&local_7d1);
          }
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"expected import name",
                   (allocator<char> *)((long)&names.nm.super_IString.str._M_str + 7));
        Lexer::err(&local_d8,&ctx->in,&local_f8);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_d8);
        wasm::Err::~Err(&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&names.nm.super_IString.str._M_str + 7));
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"expected import module name",&local_89);
      Lexer::err(&local_68,&ctx->in,&local_88);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_68);
      wasm::Err::~Err(&local_68);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
    }
  }
  else {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> import_(Ctx& ctx) {
  auto pos = ctx.in.getPos();

  if (!ctx.in.takeSExprStart("import"sv)) {
    return {};
  }

  auto mod = ctx.in.takeName();
  if (!mod) {
    return ctx.in.err("expected import module name");
  }

  auto nm = ctx.in.takeName();
  if (!nm) {
    return ctx.in.err("expected import name");
  }
  ImportNames names{*mod, *nm};

  if (ctx.in.takeSExprStart("func"sv)) {
    auto name = ctx.in.takeID();
    auto type = typeuse(ctx);
    CHECK_ERR(type);
    // TODO: function import annotations
    CHECK_ERR(ctx.addFunc(
      name ? *name : Name{}, {}, &names, *type, std::nullopt, {}, pos));
  } else if (ctx.in.takeSExprStart("table"sv)) {
    auto name = ctx.in.takeID();
    auto type = tabletype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addTable(name ? *name : Name{}, {}, &names, *type, pos));
  } else if (ctx.in.takeSExprStart("memory"sv)) {
    auto name = ctx.in.takeID();
    auto type = memtype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addMemory(name ? *name : Name{}, {}, &names, *type, pos));
  } else if (ctx.in.takeSExprStart("global"sv)) {
    auto name = ctx.in.takeID();
    auto type = globaltype(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addGlobal(
      name ? *name : Name{}, {}, &names, *type, std::nullopt, pos));
  } else if (ctx.in.takeSExprStart("tag"sv)) {
    auto name = ctx.in.takeID();
    auto type = typeuse(ctx);
    CHECK_ERR(type);
    CHECK_ERR(ctx.addTag(name ? *name : Name{}, {}, &names, *type, pos));
  } else {
    return ctx.in.err("expected import description");
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of import description");
  }
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of import");
  }

  return Ok{};
}